

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::build_workgroup_size
          (CompilerGLSL *this,
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *arguments,SpecializationConstant *wg_x,SpecializationConstant *wg_y,
          SpecializationConstant *wg_z)

{
  uint32_t uVar1;
  SPIREntryPoint *pSVar2;
  SPIRConstant *pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  string sStack_58;
  SpecializationConstant *local_38;
  
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)wg_y;
  local_38 = wg_z;
  pSVar2 = Compiler::get_entry_point(&this->super_Compiler);
  uVar1 = (wg_x->id).id;
  if (uVar1 == 0) {
    join<char_const(&)[16],unsigned_int&>
              (&sStack_58,(spirv_cross *)"local_size_x = ",(char (*) [16])&pSVar2->workgroup_size,
               (uint *)ts_1);
  }
  else if ((this->options).vulkan_semantics == true) {
    join<char_const(&)[19],unsigned_int_const&>
              (&sStack_58,(spirv_cross *)"local_size_x_id = ",(char (*) [19])&wg_x->constant_id,
               (uint *)ts_1);
  }
  else {
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar1);
    join<char_const(&)[16],std::__cxx11::string&>
              (&sStack_58,(spirv_cross *)"local_size_x = ",
               (char (*) [16])&pSVar3->specialization_constant_macro_name,ts_1);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(arguments,&sStack_58);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  uVar1 = (wg_y->id).id;
  if (uVar1 == 0) {
    join<char_const(&)[16],unsigned_int&>
              (&sStack_58,(spirv_cross *)"local_size_y = ",
               (char (*) [16])&(pSVar2->workgroup_size).y,(uint *)ts_1);
  }
  else if ((this->options).vulkan_semantics == true) {
    join<char_const(&)[19],unsigned_int_const&>
              (&sStack_58,(spirv_cross *)"local_size_y_id = ",(char (*) [19])&wg_y->constant_id,
               (uint *)ts_1);
  }
  else {
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar1);
    join<char_const(&)[16],std::__cxx11::string&>
              (&sStack_58,(spirv_cross *)"local_size_y = ",
               (char (*) [16])&pSVar3->specialization_constant_macro_name,ts_1);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(arguments,&sStack_58);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  uVar1 = (local_38->id).id;
  if (uVar1 == 0) {
    join<char_const(&)[16],unsigned_int&>
              (&sStack_58,(spirv_cross *)"local_size_z = ",
               (char (*) [16])&(pSVar2->workgroup_size).z,(uint *)ts_1);
  }
  else if ((this->options).vulkan_semantics == true) {
    join<char_const(&)[19],unsigned_int_const&>
              (&sStack_58,(spirv_cross *)"local_size_z_id = ",(char (*) [19])&local_38->constant_id,
               (uint *)ts_1);
  }
  else {
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar1);
    join<char_const(&)[16],std::__cxx11::string&>
              (&sStack_58,(spirv_cross *)"local_size_z = ",
               (char (*) [16])&pSVar3->specialization_constant_macro_name,ts_1);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(arguments,&sStack_58);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void CompilerGLSL::build_workgroup_size(SmallVector<string> &arguments, const SpecializationConstant &wg_x,
                                        const SpecializationConstant &wg_y, const SpecializationConstant &wg_z)
{
	auto &execution = get_entry_point();

	if (wg_x.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_x_id = ", wg_x.constant_id));
		else
			arguments.push_back(join("local_size_x = ", get<SPIRConstant>(wg_x.id).specialization_constant_macro_name));
	}
	else
		arguments.push_back(join("local_size_x = ", execution.workgroup_size.x));

	if (wg_y.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_y_id = ", wg_y.constant_id));
		else
			arguments.push_back(join("local_size_y = ", get<SPIRConstant>(wg_y.id).specialization_constant_macro_name));
	}
	else
		arguments.push_back(join("local_size_y = ", execution.workgroup_size.y));

	if (wg_z.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_z_id = ", wg_z.constant_id));
		else
			arguments.push_back(join("local_size_z = ", get<SPIRConstant>(wg_z.id).specialization_constant_macro_name));
	}
	else
		arguments.push_back(join("local_size_z = ", execution.workgroup_size.z));
}